

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

BoxArray * __thiscall amrex::BoxArray::refine(BoxArray *this,IntVect *iv)

{
  int iVar1;
  element_type *peVar2;
  long lVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uniqify(this);
  peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar3 = *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data;
  uVar5 = (int)((long)*(pointer *)
                       ((long)&(peVar2->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar3 >> 2) * -0x49249249;
  if (0 < (int)uVar5) {
    uVar6 = (ulong)(uVar5 & 0x7fffffff);
    puVar4 = (uint *)(lVar3 + 0x18);
    do {
      if (((iv->vect[0] != 1) || (iv->vect[1] != 1)) || (iv->vect[2] != 1)) {
        uVar5 = *puVar4;
        puVar4[-6] = iv->vect[0] * puVar4[-6];
        puVar4[-5] = puVar4[-5] * iv->vect[1];
        puVar4[-4] = puVar4[-4] * iv->vect[2];
        uVar9 = puVar4[-3] + (~uVar5 & 1);
        puVar4[-3] = uVar9;
        uVar7 = (uint)((uVar5 & 2) == 0);
        uVar10 = puVar4[-2] + uVar7;
        puVar4[-2] = uVar10;
        uVar8 = (uint)((uVar5 & 4) == 0);
        uVar11 = puVar4[-1] + uVar8;
        puVar4[-1] = uVar11;
        uVar9 = uVar9 * iv->vect[0];
        puVar4[-3] = uVar9;
        uVar10 = uVar10 * iv->vect[1];
        puVar4[-2] = uVar10;
        iVar1 = iv->vect[2];
        puVar4[-3] = uVar9 - (~uVar5 & 1);
        puVar4[-2] = uVar10 - uVar7;
        puVar4[-1] = uVar11 * iVar1 - uVar8;
      }
      puVar4 = puVar4 + 7;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return this;
}

Assistant:

BoxArray&
BoxArray::refine (const IntVect& iv)
{
    uniqify();

    const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++) {
        BL_ASSERT(m_ref->m_abox[i].ok());
        m_ref->m_abox[i].refine(iv);
    }
    return *this;
}